

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

string * __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::get_token_string(string *__return_storage_ptr__,
                  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  *this)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  ostream *poVar4;
  char *pcVar5;
  string asStack_1d8 [32];
  stringstream ss;
  ostream local_1a8 [376];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar2 = (this->token_string).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pcVar5 = (this->token_string).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start; pcVar5 != pcVar2; pcVar5 = pcVar5 + 1) {
    cVar1 = *pcVar5;
    if ((uint)(int)cVar1 < 0x20) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar4 = std::operator<<(local_1a8,"<U+");
      lVar3 = *(long *)poVar4;
      *(undefined8 *)(poVar4 + *(long *)(lVar3 + -0x18) + 0x10) = 4;
      *(uint *)(poVar4 + *(long *)(lVar3 + -0x18) + 0x18) =
           *(uint *)(poVar4 + *(long *)(lVar3 + -0x18) + 0x18) | 0x4000;
      poVar4 = std::operator<<(poVar4,0x30);
      *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
           *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)cVar1);
      std::operator<<(poVar4,">");
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string(asStack_1d8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    }
    else {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_token_string() const
{
// escape control characters
std::string result;
for (const auto c : token_string)
{
if ('\x00' <= c and c <= '\x1F')
{
// escape control characters
std::stringstream ss;
ss << "<U+" << std::setw(4) << std::uppercase << std::setfill('0')
<< std::hex << static_cast<int>(c) << ">";
result += ss.str();
}
else
{
// add character as is
result.push_back(c);
}
}

return result;
}